

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_schnorr.cpp
# Opt level: O0

SchnorrKeyPairDataStruct *
cfd::js::api::json::SchnorrApi::TweakAddSchnorrPubkeyFromPrivkey
          (SchnorrKeyPairDataStruct *__return_storage_ptr__,TweakPrivkeyDataStruct *request)

{
  TweakPrivkeyDataStruct *this;
  string *in_R8;
  allocator local_151;
  function<cfd::js::api::SchnorrKeyPairDataStruct_(const_cfd::js::api::TweakPrivkeyDataStruct_&)>
  local_150;
  undefined1 local_130 [278];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  TweakPrivkeyDataStruct *pTStack_18;
  anon_class_1_0_00000001 call_func;
  TweakPrivkeyDataStruct *request_local;
  SchnorrKeyPairDataStruct *result;
  
  local_1a = 0;
  pTStack_18 = request;
  SchnorrKeyPairDataStruct::SchnorrKeyPairDataStruct(__return_storage_ptr__);
  this = pTStack_18;
  std::function<cfd::js::api::SchnorrKeyPairDataStruct(cfd::js::api::TweakPrivkeyDataStruct_const&)>
  ::
  function<cfd::js::api::json::SchnorrApi::TweakAddSchnorrPubkeyFromPrivkey(cfd::js::api::TweakPrivkeyDataStruct_const&)::__0&,void>
            ((function<cfd::js::api::SchnorrKeyPairDataStruct(cfd::js::api::TweakPrivkeyDataStruct_const&)>
              *)local_130,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_150,"TweakAddSchnorrPubkeyFromPrivkey",&local_151);
  ExecuteStructApi<cfd::js::api::TweakPrivkeyDataStruct,cfd::js::api::SchnorrKeyPairDataStruct>
            ((SchnorrKeyPairDataStruct *)(local_130 + 0x20),(api *)this,
             (TweakPrivkeyDataStruct *)local_130,&local_150,in_R8);
  SchnorrKeyPairDataStruct::operator=
            (__return_storage_ptr__,(SchnorrKeyPairDataStruct *)(local_130 + 0x20));
  SchnorrKeyPairDataStruct::~SchnorrKeyPairDataStruct
            ((SchnorrKeyPairDataStruct *)(local_130 + 0x20));
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::
  function<cfd::js::api::SchnorrKeyPairDataStruct_(const_cfd::js::api::TweakPrivkeyDataStruct_&)>::
  ~function((function<cfd::js::api::SchnorrKeyPairDataStruct_(const_cfd::js::api::TweakPrivkeyDataStruct_&)>
             *)local_130);
  return __return_storage_ptr__;
}

Assistant:

SchnorrKeyPairDataStruct SchnorrApi::TweakAddSchnorrPubkeyFromPrivkey(
    const TweakPrivkeyDataStruct& request) {
  auto call_func =
      [](const TweakPrivkeyDataStruct& request) -> SchnorrKeyPairDataStruct {
    SchnorrKeyPairDataStruct response;

    Privkey privkey(request.privkey);
    ByteData256 tweak(request.tweak);
    Privkey tweaked_privkey;
    bool parity = false;
    auto pubkey = SchnorrPubkey::CreateTweakAddFromPrivkey(
        privkey, tweak, &tweaked_privkey, &parity);
    response.pubkey = pubkey.GetHex();
    response.privkey = tweaked_privkey.GetHex();
    response.parity = parity;
    return response;
  };

  SchnorrKeyPairDataStruct result;
  result = ExecuteStructApi<TweakPrivkeyDataStruct, SchnorrKeyPairDataStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}